

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O1

void Iso_ManAssignAdjacency(Iso_Man_t *p)

{
  Aig_Man_t *pAVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  void **ppvVar8;
  uint uVar9;
  long lVar10;
  Iso_Obj_t *pIVar11;
  uint uVar12;
  Iso_Obj_t *pIVar13;
  long lVar14;
  
  pAVar1 = p->pAig;
  pVVar2 = pAVar1->vObjs;
  iVar4 = pVVar2->nSize;
  lVar5 = (long)iVar4;
  if (0 < lVar5) {
    ppvVar8 = pVVar2->pArray;
    lVar10 = 0;
    do {
      pvVar3 = *ppvVar8;
      if (pvVar3 != (void *)0x0) {
        pIVar11 = p->pObjs;
        *(undefined8 *)((long)&pIVar11->FaninSig + lVar10) = 0;
        uVar9 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        if (((uVar9 & 7) != 3) && (0xfffffffd < (uVar9 & 7) - 7)) {
          uVar6 = *(ulong *)((long)pvVar3 + 8);
          if (uVar6 == 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = (long)*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
          }
          uVar9 = pIVar11[lVar14].FaninSig;
          *(uint *)((long)&pIVar11->FaninSig + lVar10) = uVar9;
          uVar12 = pIVar11[lVar14].Id;
          if (uVar12 != 0) {
            if ((int)uVar12 < 0) goto LAB_00629b24;
            *(uint *)((long)&pIVar11->FaninSig + lVar10) =
                 uVar12 * s_1kPrimes[((uint)uVar6 & 1) + (uVar12 & 0x1ff) * 2] + uVar9;
          }
          uVar6 = *(ulong *)((long)pvVar3 + 0x10);
          if (uVar6 == 0) {
            lVar14 = -1;
          }
          else {
            lVar14 = (long)*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
          }
          iVar7 = *(int *)((long)&pIVar11->FaninSig + lVar10) + pIVar11[lVar14].FaninSig;
          *(int *)((long)&pIVar11->FaninSig + lVar10) = iVar7;
          uVar9 = pIVar11[lVar14].Id;
          if (uVar9 != 0) {
            if ((int)uVar9 < 0) goto LAB_00629b24;
            *(uint *)((long)&pIVar11->FaninSig + lVar10) =
                 uVar9 * s_1kPrimes[((uint)uVar6 & 1) + (uVar9 & 0x1ff) * 2] + iVar7;
          }
        }
      }
      ppvVar8 = ppvVar8 + 1;
      lVar10 = lVar10 + 0x18;
    } while (lVar5 * 0x18 != lVar10);
  }
  if (0 < iVar4) {
    ppvVar8 = pVVar2->pArray;
    lVar10 = lVar5 * 3 + -2;
    lVar5 = lVar5 + 1;
    do {
      pvVar3 = ppvVar8[lVar5 + -2];
      if (pvVar3 != (void *)0x0) {
        uVar9 = (uint)*(undefined8 *)((long)pvVar3 + 0x18);
        uVar12 = uVar9 & 7;
        if (uVar12 != 2) {
          if (((ulong)pvVar3 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          if (uVar12 != 1) {
            pIVar11 = p->pObjs;
            if ((uVar12 == 3) && ((&pIVar11->iNext)[lVar10 * 2] != 0)) {
              __assert_fail("!Aig_ObjIsCo(pObj) || pIso->Id == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                            ,0x317,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
            }
            if ((uVar9 & 7) - 7 < 0xfffffffe) {
              if (uVar12 != 3) goto LAB_0062995a;
              uVar6 = *(ulong *)((long)pvVar3 + 8);
              if (uVar6 == 0) {
                lVar14 = -1;
              }
              else {
                lVar14 = (long)*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
              }
              uVar12 = pIVar11[lVar14].FanoutSig + *(int *)(&pIVar11->field_0x0 + lVar10 * 8);
              pIVar11[lVar14].FanoutSig = uVar12;
              uVar9 = (&pIVar11->iNext)[lVar10 * 2];
            }
            else {
              uVar6 = *(ulong *)((long)pvVar3 + 8);
              if (uVar6 == 0) {
                lVar14 = -1;
              }
              else {
                lVar14 = (long)*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
              }
              uVar12 = pIVar11[lVar14].FanoutSig + *(int *)(&pIVar11->field_0x0 + lVar10 * 8);
              pIVar11[lVar14].FanoutSig = uVar12;
              uVar9 = (&pIVar11->iNext)[lVar10 * 2];
              if (uVar9 != 0) {
                if ((int)uVar9 < 0) goto LAB_00629b24;
                pIVar11[lVar14].FanoutSig =
                     s_1kPrimes[((uint)uVar6 & 1) + (uVar9 & 0x1ff) * 2] * uVar9 + uVar12;
              }
              uVar6 = *(ulong *)((long)pvVar3 + 0x10);
              if (uVar6 == 0) {
                lVar14 = -1;
              }
              else {
                lVar14 = (long)*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24);
              }
              uVar12 = pIVar11[lVar14].FanoutSig + *(int *)(&pIVar11->field_0x0 + lVar10 * 8);
              pIVar11[lVar14].FanoutSig = uVar12;
            }
            if (uVar9 != 0) {
              if ((int)uVar9 < 0) goto LAB_00629b24;
              pIVar11[lVar14].FanoutSig =
                   uVar9 * s_1kPrimes[((uint)uVar6 & 1) + (uVar9 & 0x1ff) * 2] + uVar12;
            }
          }
        }
      }
LAB_0062995a:
      lVar5 = lVar5 + -1;
      lVar10 = lVar10 + -3;
    } while (1 < lVar5);
  }
  if (0 < pAVar1->nRegs) {
    pVVar2 = pAVar1->vCos;
    iVar4 = -pAVar1->nRegs;
    do {
      uVar9 = pAVar1->nObjs[3] + iVar4;
      if (((((int)uVar9 < 0) || (pVVar2->nSize <= (int)uVar9)) ||
          (uVar12 = pAVar1->nObjs[2] + iVar4, (int)uVar12 < 0)) ||
         (pAVar1->vCis->nSize <= (int)uVar12)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar6 = *(ulong *)((long)pVVar2->pArray[uVar9] + 8);
      if ((uVar6 == 0) || (*(int *)((uVar6 & 0xfffffffffffffffe) + 0x24) != 0)) {
        iVar7 = *(int *)((long)pAVar1->vCis->pArray[uVar12] + 0x24);
        if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
LAB_00629b05:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                        ,300,"Iso_Obj_t *Iso_ManObj(Iso_Man_t *, int)");
        }
        if (iVar7 == 0) {
          pIVar11 = (Iso_Obj_t *)0x0;
        }
        else {
          pIVar11 = p->pObjs + iVar7;
        }
        if (uVar6 == 0) {
          uVar9 = 0xffffffff;
        }
        else {
          uVar9 = *(uint *)((uVar6 & 0xfffffffffffffffe) + 0x24);
        }
        if (((int)uVar9 < 0) || (p->nObjs <= (int)uVar9)) goto LAB_00629b05;
        if (uVar9 == 0) {
          pIVar13 = (Iso_Obj_t *)0x0;
        }
        else {
          pIVar13 = p->pObjs + uVar9;
        }
        if (pIVar11->FaninSig != 0) {
          __assert_fail("pIso->FaninSig == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                        ,0x34d,"void Iso_ManAssignAdjacency(Iso_Man_t *)");
        }
        uVar9 = pIVar13->FaninSig;
        pIVar11->FaninSig = uVar9;
        uVar12 = pIVar13->Id;
        if (uVar12 != 0) {
          if ((int)uVar12 < 0) {
LAB_00629b24:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          pIVar11->FaninSig = uVar12 * s_1kPrimes[((uint)uVar6 & 1) + (uVar12 & 0x1ff) * 2] + uVar9;
        }
        uVar12 = pIVar13->FanoutSig + pIVar11->FanoutSig;
        pIVar13->FanoutSig = uVar12;
        uVar9 = pIVar11->Id;
        if (uVar9 != 0) {
          if ((int)uVar9 < 0) goto LAB_00629b24;
          pIVar13->FanoutSig = uVar9 * s_1kPrimes[((uint)uVar6 & 1) + (uVar9 & 0x1ff) * 2] + uVar12;
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0);
  }
  return;
}

Assistant:

void Iso_ManAssignAdjacency( Iso_Man_t * p )
{
    int fUseXor = 0;
    Iso_Obj_t * pIso, * pIsoF;
    Aig_Obj_t * pObj, * pObjLi;
    int i;

    // create TFI signatures
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        pIso = p->pObjs + i;
        pIso->FaninSig = 0;
        pIso->FanoutSig = 0;

        if ( Aig_ObjIsCo(pObj) )
            continue;
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig ^= pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIso->FaninSig += pIsoF->FaninSig;
                if ( pIsoF->Id )
                    pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
        }
    }
    // create TFO signatures
    Aig_ManForEachObjReverse( p->pAig, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) || Aig_ObjIsConst1(pObj) )
            continue;
        pIso = p->pObjs + i;
        assert( !Aig_ObjIsCo(pObj) || pIso->Id == 0 );
        if ( fUseXor )
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig ^= pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
        else
        {
            if ( Aig_ObjIsNode(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];

                pIsoF = p->pObjs + Aig_ObjFaninId1(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC1(pObj)) & ISO_MASK];
            }
            else if ( Aig_ObjIsCo(pObj) )
            {
                pIsoF = p->pObjs + Aig_ObjFaninId0(pObj);
                pIsoF->FanoutSig += pIso->FanoutSig;
                if ( pIso->Id )
                    pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObj)) & ISO_MASK];
            }
        }
    }

    // consider flops
    Aig_ManForEachLiLoSeq( p->pAig, pObjLi, pObj, i )
    {
        if ( Aig_ObjFaninId0(pObjLi) == 0 ) // ignore constant!
            continue;
        pIso  = Iso_ManObj( p, Aig_ObjId(pObj) );
        pIsoF = Iso_ManObj( p, Aig_ObjFaninId0(pObjLi) );
        assert( pIso->FaninSig == 0 );
//        assert( pIsoF->FanoutSig == 0 );

        if ( fUseXor )
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig ^= s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig ^= s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
        else
        {
            pIso->FaninSig = pIsoF->FaninSig;
            if ( pIsoF->Id )
                pIso->FaninSig += pIsoF->Id * s_1kPrimes[Abc_Var2Lit(pIsoF->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];

            pIsoF->FanoutSig += pIso->FanoutSig;
            if ( pIso->Id )
                pIsoF->FanoutSig += pIso->Id * s_1kPrimes[Abc_Var2Lit(pIso->Id, Aig_ObjFaninC0(pObjLi)) & ISO_MASK];
        }
    }
}